

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O3

void Abc_NtkRetimeShareLatches(Abc_Ntk_t *pNtk,int fInitial)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pNodeTo;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **__ptr;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 10;
  vNodes->nSize = 0;
  __ptr = (void **)malloc(0x50);
  vNodes->pArray = __ptr;
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar4->pArray[lVar7];
      if (pAVar1 != (Abc_Obj_t *)0x0) {
        iVar2 = Abc_NtkRetimeCheckCompatibleLatchFanouts(pAVar1);
        if (1 < iVar2) {
          lVar3 = (long)(pAVar1->vFanouts).nSize;
          if (lVar3 < 1) {
LAB_004d2371:
            __assert_fail("pLatchTop && Abc_ObjIsLatch(pLatchTop)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retIncrem.c"
                          ,0x1c4,"void Abc_NtkRetimeShareLatches(Abc_Ntk_t *, int)");
          }
          lVar5 = 0;
          do {
            pNodeTo = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanouts).pArray[lVar5]];
            uVar6 = *(uint *)&pNodeTo->field_0x14;
            if ((uVar6 & 0xf) == 8) goto LAB_004d22b9;
            lVar5 = lVar5 + 1;
          } while (lVar3 != lVar5);
          uVar6 = *(uint *)&pNodeTo->field_0x14;
LAB_004d22b9:
          if ((uVar6 & 0xf) != 8) goto LAB_004d2371;
          Abc_NodeCollectFanouts(pAVar1,vNodes);
          iVar2 = vNodes->nSize;
          if (0 < iVar2) {
            lVar3 = 0;
            do {
              pAVar1 = (Abc_Obj_t *)vNodes->pArray[lVar3];
              if (((pAVar1 != pNodeTo) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8)) &&
                 ((pAVar1->field_5).pData == (pNodeTo->field_5).pData)) {
                if (fInitial != 0) {
                  Abc_ObjAddFanin((pAVar1->field_6).pCopy,(pNodeTo->field_6).pCopy);
                }
                Abc_ObjTransferFanout(pAVar1,pNodeTo);
                Abc_NtkDeleteObj(pAVar1);
                iVar2 = vNodes->nSize;
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < iVar2);
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar7 < pVVar4->nSize);
    __ptr = vNodes->pArray;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(vNodes);
  return;
}

Assistant:

void Abc_NtkRetimeShareLatches( Abc_Ntk_t * pNtk, int fInitial )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin, * pLatchTop, * pLatchCur;
    int i, k;
    vNodes = Vec_PtrAlloc( 10 );
    // consider latch fanins
    Abc_NtkForEachObj( pNtk, pFanin, i )
    {
        if ( Abc_NtkRetimeCheckCompatibleLatchFanouts(pFanin) <= 1 )
            continue;
        // get the first latch
        pLatchTop = NULL;
        Abc_ObjForEachFanout( pFanin, pLatchTop, k )
            if ( Abc_ObjIsLatch(pLatchTop) )
                break;
        assert( pLatchTop && Abc_ObjIsLatch(pLatchTop) );
        // redirect compatible fanout latches to the first latch
        Abc_NodeCollectFanouts( pFanin, vNodes );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pLatchCur, k )
        {
            if ( !Abc_ObjIsLatch(pLatchCur) )
                continue;
            if ( pLatchCur == pLatchTop )
                continue;
            if ( pLatchCur->pData != pLatchTop->pData )
                continue;
            // connect the initial state
            if ( fInitial )
                Abc_ObjAddFanin( pLatchCur->pCopy, pLatchTop->pCopy );
            // redirect the fanouts
            Abc_ObjTransferFanout( pLatchCur, pLatchTop );
            Abc_NtkDeleteObj(pLatchCur);
        }
    }
    Vec_PtrFree( vNodes );
}